

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

void Frc_DumpGraphIntoFile(Frc_Man_t *p)

{
  Frc_Obj_t *pThis;
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  iVar7 = 0;
  uVar6 = 0;
  do {
    if ((p->nObjData <= iVar7) || (p->pObjData == (int *)0x0)) {
      __stream = fopen("x\\large\\aig\\dg1.g","w");
      iVar7 = 0;
      while ((iVar7 < p->nObjData && (p->pObjData != (int *)0x0))) {
        puVar1 = (uint *)(p->pObjData + iVar7);
        for (lVar5 = 0; (int)lVar5 < (int)puVar1[1]; lVar5 = lVar5 + 1) {
          if ((puVar1[5] != 0xffffffff) &&
             (puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar5 + 6] + 5] != 0xffffffff)) {
            fprintf(__stream,"%d %d\n");
          }
        }
        iVar7 = iVar7 + puVar1[1] + (*puVar1 >> 4) + 6;
      }
      fclose(__stream);
      return;
    }
    pThis = (Frc_Obj_t *)(p->pObjData + iVar7);
    uVar2 = *(uint *)pThis;
    if (iVar7 == 0) {
LAB_005d23f2:
      uVar4 = 0xffffffff;
    }
    else {
      if ((uVar2 & 1) == 0) {
LAB_005d23e0:
        if (uVar2 < 0x10 || (uVar2 & 3) != 0) goto LAB_005d23f2;
      }
      else {
        iVar3 = Frc_ObjFanoutsAreCos(pThis);
        if (iVar3 != 0) goto LAB_005d23e0;
      }
      uVar4 = uVar6;
      uVar6 = uVar6 + 1;
    }
    (pThis->field_9).iFanin = uVar4;
    iVar7 = iVar7 + (uVar2 >> 4) + pThis->nFanouts + 6;
  } while( true );
}

Assistant:

void Frc_DumpGraphIntoFile( Frc_Man_t * p )
{
    FILE * pFile;
    Frc_Obj_t * pThis, * pNext;
    int i, k, Counter = 0;
    // assign numbers to CIs and internal nodes
    Frc_ManForEachObj( p, pThis, i )
    {
        if ( i && ((Frc_ObjIsCi(pThis) && !Frc_ObjFanoutsAreCos(pThis)) || Frc_ObjIsNode(pThis)) )
            pThis->iFanin = Counter++;
        else
            pThis->iFanin = ~0;
    }
    // assign numbers to all other nodes
    pFile = fopen( "x\\large\\aig\\dg1.g", "w" );
    Frc_ManForEachObj( p, pThis, i )
    {
        Frc_ObjForEachFanout( pThis, pNext, k )
        {
            if ( ~pThis->iFanin && ~pNext->iFanin )
                fprintf( pFile, "%d %d\n", pThis->iFanin, pNext->iFanin );
        }
    }
    fclose( pFile );
}